

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTasks.cpp
# Opt level: O3

Type * __thiscall
slang::ast::builtins::AssertControlTask::checkArguments
          (AssertControlTask *this,ASTContext *context,Args *args,SourceRange range,
          Expression *param_4)

{
  Compilation *pCVar1;
  Expression *pEVar2;
  Symbol *this_00;
  bool bVar3;
  Scope *pSVar4;
  Type *pTVar5;
  ulong uVar6;
  
  pCVar1 = ((context->scope).ptr)->compilation;
  bVar3 = SystemSubroutine::checkArgCount
                    ((SystemSubroutine *)this,context,false,args,range,(ulong)this->isFullMethod,
                     0x7fffffff);
  if (bVar3) {
    if ((args->_M_extent)._M_extent_value != 0) {
      uVar6 = 0;
      do {
        bVar3 = uVar6 != 0;
        if (this->isFullMethod != false) {
          bVar3 = 3 < uVar6;
        }
        pEVar2 = args->_M_ptr[uVar6];
        if (bVar3) {
          if (pEVar2->kind == ArbitrarySymbol) {
            this_00 = *(Symbol **)(pEVar2 + 1);
            pSVar4 = Symbol::scopeOrNull(this_00);
            if ((pSVar4 != (Scope *)0x0) || (this_00->kind == Instance)) goto LAB_00487849;
          }
          bVar3 = Scope::isUninstantiated((context->scope).ptr);
          if (!bVar3) {
            ASTContext::addDiag(context,(DiagCode)0xe000b,args->_M_ptr[uVar6]->sourceRange);
          }
          goto LAB_00487883;
        }
        bVar3 = Type::isIntegral((pEVar2->type).ptr);
        if (!bVar3) {
          pTVar5 = SystemSubroutine::badArg((SystemSubroutine *)this,context,args->_M_ptr[uVar6]);
          return pTVar5;
        }
LAB_00487849:
        uVar6 = uVar6 + 1;
      } while (uVar6 < (args->_M_extent)._M_extent_value);
    }
    pTVar5 = pCVar1->voidType;
  }
  else {
LAB_00487883:
    pTVar5 = pCVar1->errorType;
  }
  return pTVar5;
}

Assistant:

const Type& checkArguments(const ASTContext& context, const Args& args, SourceRange range,
                               const Expression*) const final {
        auto& comp = context.getCompilation();
        if (!checkArgCount(context, false, args, range, isFullMethod ? 1 : 0, INT32_MAX))
            return comp.getErrorType();

        for (size_t i = 0; i < args.size(); i++) {
            // If this is $assertcontrol, the first four args are integer expressions.
            // Otherwise, only the first arg is an integer expression. The rest, in both
            // cases, are hierarchical references.
            if ((isFullMethod && i < 4) || (!isFullMethod && i == 0)) {
                if (!args[i]->type->isIntegral())
                    return badArg(context, *args[i]);
            }
            else {
                auto isScope = [](const Symbol& symbol) {
                    return symbol.isScope() || symbol.kind == SymbolKind::Instance;
                };

                if (args[i]->kind != ExpressionKind::ArbitrarySymbol ||
                    !isScope(*args[i]->as<ArbitrarySymbolExpression>().symbol)) {
                    if (!context.scope->isUninstantiated())
                        context.addDiag(diag::ExpectedScopeOrAssert, args[i]->sourceRange);
                    return comp.getErrorType();
                }
            }
        }

        return comp.getVoidType();
    }